

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O1

void __thiscall
cfd::core::Secp256k1::RangeProofInfoSecp256k1
          (Secp256k1 *this,ByteData *range_proof,int *exponent,int *mantissa,uint64_t *min_value,
          uint64_t *max_value)

{
  void *pvVar1;
  size_t sVar2;
  CfdException *pCVar3;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> range_proof_bytes;
  int local_74;
  undefined1 local_70 [32];
  uint64_t *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  pvVar1 = this->secp256k1_context_;
  if (pvVar1 == (void *)0x0) {
    local_70._0_8_ = "cfdcore_secp256k1.cpp";
    local_70._8_4_ = 0x1d9;
    local_70._16_8_ = "RangeProofInfoSecp256k1";
    logger::log<>((CfdSourceLocation *)local_70,kCfdLogLevelWarning,"Secp256k1 context is NULL.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_70._0_8_ = local_70 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Secp256k1 context is NULL.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_50 = max_value;
  sVar2 = ByteData::GetDataSize(range_proof);
  if (sVar2 != 0) {
    ByteData::GetBytes(&local_48,range_proof);
    local_74 = secp256k1_rangeproof_info
                         (pvVar1,exponent,mantissa,min_value,local_50,
                          local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_48.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    if (local_74 == 1) {
      if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    local_70._0_8_ = "cfdcore_secp256k1.cpp";
    local_70._8_4_ = 0x1e9;
    local_70._16_8_ = "RangeProofInfoSecp256k1";
    logger::log<int&>((CfdSourceLocation *)local_70,kCfdLogLevelWarning,
                      "secp256k1_rangeproof_info Error.({})",&local_74);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_70._0_8_ = local_70 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Secp256k1 decode range proof info Error.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_70._0_8_ = "cfdcore_secp256k1.cpp";
  local_70._8_4_ = 0x1de;
  local_70._16_8_ = "RangeProofInfoSecp256k1";
  logger::log<>((CfdSourceLocation *)local_70,kCfdLogLevelWarning,"Secp256k1 range proof is empty.")
  ;
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_70._0_8_ = local_70 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Secp256k1 empty range proof Error.","");
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Secp256k1::RangeProofInfoSecp256k1(
    const ByteData& range_proof, int* exponent, int* mantissa,
    uint64_t* min_value, uint64_t* max_value) {
  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);
  if (secp256k1_context_ == nullptr) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }
  if (!range_proof.GetDataSize()) {
    warn(CFD_LOG_SOURCE, "Secp256k1 range proof is empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 empty range proof Error.");
  }

  std::vector<uint8_t> range_proof_bytes = range_proof.GetBytes();
  int ret = secp256k1_rangeproof_info(
      context, exponent, mantissa, min_value, max_value,
      range_proof_bytes.data(), range_proof_bytes.size());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_rangeproof_info Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 decode range proof info Error.");
  }
}